

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void __thiscall xray_re::xr_ogf_v3::load_s_ikdata_0(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  pointer ppxVar2;
  pointer ppxVar3;
  
  ppxVar2 = (this->super_xr_ogf).super_xr_object.m_bones.
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppxVar3 = (this->super_xr_ogf).super_xr_object.m_bones.
                 super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppxVar3 != ppxVar2; ppxVar3 = ppxVar3 + 1) {
    bone_io::import_ikdata_0((bone_io *)*ppxVar3,r);
  }
  pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 2);
  *pbVar1 = *pbVar1 | 0x80;
  ppxVar3 = (this->super_xr_ogf).super_xr_object.m_bones.
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppxVar3 ==
        (this->super_xr_ogf).super_xr_object.m_bones.
        super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    if ((*ppxVar3)->m_parent == (xr_bone *)0x0) break;
    ppxVar3 = ppxVar3 + 1;
  }
  fix_bind(*ppxVar3);
  return;
}

Assistant:

void xr_ogf_v3::load_s_ikdata_0(xr_reader& r)
{
	for (xr_bone_vec_it it = m_bones.begin(), end = m_bones.end(); it != end; ++it)
		static_cast<bone_io*>(*it)->import_ikdata_0(r);
	set_chunk_loaded(OGF3_S_IKDATA_0);

	//� ������ ������� �� ����� OGF3_S_IKDATA_0 bind pose ������ �������� ������������ ������
	//��� ������������� ���� ����������� ������������ ������������ �����
	for (xr_bone_vec_it it = m_bones.begin(), end = m_bones.end(); it != end; ++it)
	{
		if ((*it)->is_root())
		{
			fix_bind(*it);
			break;
		}
	}
}